

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_class_effect_msg(parser *p)

{
  wchar_t wVar1;
  long lVar2;
  long *plVar3;
  void *pvVar4;
  long *plVar5;
  char *s2;
  char *pcVar6;
  long lVar7;
  parser_error pVar8;
  
  pvVar4 = parser_priv(p);
  pVar8 = PARSE_ERROR_MISSING_RECORD_HEADER;
  if (pvVar4 != (void *)0x0) {
    wVar1 = *(wchar_t *)((long)pvVar4 + 0xf8);
    if (0 < (long)wVar1) {
      lVar2 = *(long *)((long)pvVar4 + 0x100);
      if ((lVar2 == 0) || (class_max_books < wVar1)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xfc0,"enum parser_error parse_class_effect_msg(struct parser *)");
      }
      lVar7 = (long)wVar1 * 0x20;
      wVar1 = *(wchar_t *)(lVar2 + -0x14 + lVar7);
      if (0 < (long)wVar1) {
        lVar2 = *(long *)(lVar2 + lVar7 + -8);
        if ((lVar2 == 0) || (book_max_spells < wVar1)) {
          __assert_fail("book->spells && book->num_spells <= book_max_spells",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                        ,0xfc6,"enum parser_error parse_class_effect_msg(struct parser *)");
        }
        plVar3 = *(long **)(lVar2 + -0x28 + (long)wVar1 * 0x38);
        pVar8 = PARSE_ERROR_NONE;
        if (plVar3 != (long *)0x0) {
          do {
            plVar5 = plVar3;
            plVar3 = (long *)*plVar5;
          } while ((long *)*plVar5 != (long *)0x0);
          pcVar6 = (char *)plVar5[6];
          s2 = parser_getstr(p,"text");
          pcVar6 = string_append(pcVar6,s2);
          plVar5[6] = (long)pcVar6;
          pVar8 = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return pVar8;
}

Assistant:

static enum parser_error parse_class_effect_msg(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* If there is no effect, assume that this is human and not parser error. */
	effect = spell->effect;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	effect->msg = string_append(effect->msg, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}